

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::PromisedAsyncIoStream::abortRead(PromisedAsyncIoStream *this)

{
  AsyncIoStream *pAVar1;
  ForkedPromise<void> local_30;
  Own<kj::AsyncIoStream,_std::nullptr_t> *local_20;
  Own<kj::AsyncIoStream,_std::nullptr_t> *s;
  Own<kj::AsyncIoStream,_std::nullptr_t> *_s2469;
  PromisedAsyncIoStream *this_local;
  
  _s2469 = (Own<kj::AsyncIoStream,_std::nullptr_t> *)this;
  local_20 = kj::_::readMaybe<kj::AsyncIoStream,decltype(nullptr)>(&this->stream);
  s = local_20;
  if (local_20 == (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch(&local_30);
    Promise<void>::then<kj::(anonymous_namespace)::PromisedAsyncIoStream::abortRead()::_lambda()_1_>
              ((Promise<void> *)&local_30.hub.ptr,(Type *)&local_30);
    TaskSet::add(&this->tasks,(Promise<void> *)&local_30.hub.ptr);
    Promise<void>::~Promise((Promise<void> *)&local_30.hub.ptr);
    Promise<void>::~Promise((Promise<void> *)&local_30);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(local_20);
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_SOME(s, stream) {
      return s->abortRead();
    } else {
      tasks.add(promise.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(stream)->abortRead();
      }));
    }
  }